

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2608::clock_fm_and_adpcm(ym2608 *this)

{
  uint32_t uVar1;
  uint32_t chanmask;
  clock_t cVar2;
  ymfm_output<2> *output;
  uint32_t env_counter;
  uint32_t fmmask;
  ym2608 *this_local;
  
  uVar1 = bitfield((uint)this->m_irq_enable,7,1);
  chanmask = 7;
  if (uVar1 != 0) {
    chanmask = 0x3f;
  }
  cVar2 = fm_engine_base<ymfm::opn_registers_base<true>_>::clock
                    ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
  uVar1 = bitfield((uint32_t)cVar2,0,2);
  if (uVar1 == 0) {
    bitfield((uint32_t)cVar2,2,1);
    adpcm_a_engine::clock(&this->m_adpcm_a);
  }
  adpcm_b_engine::clock(&this->m_adpcm_b);
  output = ymfm_output<2>::clear(&this->m_last_fm);
  fm_engine_base<ymfm::opn_registers_base<true>_>::output
            ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,output,1,0x7fff,chanmask
            );
  adpcm_a_engine::output<2>(&this->m_adpcm_a,&this->m_last_fm,0x3f);
  adpcm_b_engine::output<2>(&this->m_adpcm_b,&this->m_last_fm,1);
  ymfm_output<2>::clamp16(&this->m_last_fm);
  return;
}

Assistant:

void ym2608::clock_fm_and_adpcm()
{
	// top bit of the IRQ enable flags controls 3-channel vs 6-channel mode
	uint32_t fmmask = bitfield(m_irq_enable, 7) ? 0x3f : 0x07;

	// clock the system
	uint32_t env_counter = m_fm.clock(fm_engine::ALL_CHANNELS);

	// clock the ADPCM-A engine on every envelope cycle
	// (channels 4 and 5 clock every 2 envelope clocks)
	if (bitfield(env_counter, 0, 2) == 0)
		m_adpcm_a.clock(bitfield(env_counter, 2) ? 0x0f : 0x3f);

	// clock the ADPCM-B engine every cycle
	m_adpcm_b.clock();

	// update the FM content; OPNA is 13-bit with no intermediate clipping
	m_fm.output(m_last_fm.clear(), 1, 32767, fmmask);

	// mix in the ADPCM and clamp
	m_adpcm_a.output(m_last_fm, 0x3f);
	m_adpcm_b.output(m_last_fm, 1);
	m_last_fm.clamp16();
}